

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_uart.c
# Opt level: O3

void test_parity(void)

{
  cio_uart_parity parity_00;
  cio_error cVar1;
  long lVar2;
  cio_uart_parity parity;
  cio_uart uart;
  cio_uart_parity local_10b4;
  cio_uart local_10b0;
  
  lVar2 = 0;
  do {
    strncpy(local_10b0.impl.name,"/dev/stdout",0x1001);
    cio_uart_init(&local_10b0,&loop,(cio_uart_close_hook_t)0x0);
    parity_00 = *(cio_uart_parity *)((long)&DAT_00105220 + lVar2);
    cVar1 = cio_uart_set_parity(&local_10b0,parity_00);
    UnityAssertEqualNumber(0,(long)cVar1,"Setting parity failed",0x6a,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_uart_get_parity(&local_10b0,&local_10b4);
    UnityAssertEqualNumber(0,(long)cVar1,"Getting parity failed",0x6e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((ulong)parity_00,(ulong)local_10b4,"Get/Set of parity does not match!",0x70,
               UNITY_DISPLAY_STYLE_INT);
    cio_uart_close(&local_10b0);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x14);
  return;
}

Assistant:

static void test_parity(void)
{
	enum cio_uart_parity tests[] = {CIO_UART_PARITY_NONE, CIO_UART_PARITY_ODD, CIO_UART_PARITY_EVEN, CIO_UART_PARITY_MARK, CIO_UART_PARITY_SPACE};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct cio_uart uart;
		strncpy(uart.impl.name, "/dev/stdout", sizeof(uart.impl.name));
		cio_uart_init(&uart, &loop, NULL);
		enum cio_error err = cio_uart_set_parity(&uart, tests[i]);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Setting parity failed");

		enum cio_uart_parity parity;
		err = cio_uart_get_parity(&uart, &parity);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Getting parity failed");

		TEST_ASSERT_EQUAL_MESSAGE(tests[i], parity, "Get/Set of parity does not match!");
		cio_uart_close(&uart);
	}
}